

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O3

void __thiscall wasm::PostEmscripten::optimizeExceptions(PostEmscripten *this,Module *module)

{
  size_t *this_00;
  pointer puVar1;
  Function *pFVar2;
  char *pcVar3;
  pointer puVar4;
  Module *wasm;
  bool bVar5;
  char *pcVar6;
  byte bVar7;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *imp;
  pointer puVar8;
  WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_> local_280;
  CallGraphPropertyAnalysis<Info> *local_150;
  size_t *local_148;
  undefined1 local_140 [8];
  CallGraphPropertyAnalysis<Info> analyzer;
  FlatTable flatTable;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Module *local_40;
  PostEmscripten *local_38;
  
  puVar8 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar1) {
    bVar7 = 0;
    pcVar6 = DAT_010b0e58;
    local_40 = module;
    local_38 = this;
    do {
      pFVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
      if ((pcVar3 != (char *)0x0) && (pcVar3 == pcVar6)) {
        bVar5 = IString::startsWith<8>
                          (&(pFVar2->super_Importable).base.super_IString,(char (*) [8])"invoke_");
        bVar7 = bVar7 | bVar5;
        pcVar6 = DAT_010b0e58;
      }
      wasm = local_40;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
    if ((bVar7 != 0) &&
       (puVar4 = (local_40->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       puVar4 != (local_40->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      this_00 = &analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      TableUtils::FlatTable::FlatTable
                ((FlatTable *)this_00,local_40,
                 (puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
      if ((char)flatTable.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == '\x01') {
        flatTable.valid = false;
        flatTable._25_7_ = 0;
        wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::CallGraphPropertyAnalysis
                  ((CallGraphPropertyAnalysis<Info> *)local_140,wasm,(Func *)&flatTable.valid);
        std::
        _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:283:16)>
        ::_M_manager((_Any_data *)&flatTable.valid,(_Any_data *)&flatTable.valid,__destroy_functor);
        local_c8._M_unused._M_object = (void *)0x0;
        local_c8._8_8_ = 0;
        local_b0 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:292:28)>
                   ::_M_invoke;
        local_b8 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:292:28)>
                   ::_M_manager;
        local_a8._M_unused._M_object = (void *)0x0;
        local_a8._8_8_ = 0;
        local_90 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:293:28)>
                   ::_M_invoke;
        local_98 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:293:28)>
                   ::_M_manager;
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = 0;
        local_70 = std::
                   _Function_handler<void_(Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:294:28)>
                   ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:294:28)>
                   ::_M_manager;
        local_68._M_unused._M_object = (void *)0x0;
        local_68._8_8_ = 0;
        local_50 = std::
                   _Function_handler<void_(const_Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:295:28)>
                   ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(const_Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp:295:28)>
                   ::_M_manager;
        wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
                  ((CallGraphPropertyAnalysis<Info> *)local_140,
                   (function<bool_(const_Info_&)> *)&local_c8,
                   (function<bool_(const_Info_&)> *)&local_a8,(function<void_(Info_&)> *)&local_88,
                   (function<void_(const_Info_&,_wasm::Function_*)> *)&local_68,
                   NonDirectCallsHaveProperty);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,__destroy_functor);
        }
        if (local_b8 != (code *)0x0) {
          (*local_b8)(&local_c8,&local_c8,__destroy_functor);
        }
        local_280.super_Pass.name._M_dataplus._M_p = (pointer)&local_280.super_Pass.name.field_2;
        local_280.super_Pass.runner = (PassRunner *)0x0;
        local_280.super_Pass.name._M_string_length = 0;
        local_280.super_Pass.name.field_2._M_local_buf[0] = '\0';
        local_280.super_Pass.passArg.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.replacep =
             (Expression **)0x0;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.usedFixed = 0;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.currFunction =
             (Function *)0x0;
        local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.currModule =
             (Module *)0x0;
        local_280.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_01074638;
        local_150 = &analyzer;
        local_148 = this_00;
        WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>::run
                  (&local_280,(local_38->super_Pass).runner,wasm);
        if (local_280.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
            super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_280.
                          super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                          super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack
                          .flexible.
                          super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_280.
                                super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .
                                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .stack.flexible.
                                super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_280.
                                super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .
                                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .stack.flexible.
                                super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        Pass::~Pass(&local_280.super_Pass);
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
        ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                     *)&analyzer);
      }
      if (analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        operator_delete((void *)analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (long)flatTable.names.
                              super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
  }
  return;
}

Assistant:

void optimizeExceptions(Module* module) {
    // First, check if this code even uses invokes.
    bool hasInvokes = false;
    for (auto& imp : module->functions) {
      if (isInvoke(imp.get())) {
        hasInvokes = true;
      }
    }
    if (!hasInvokes || module->tables.empty()) {
      return;
    }
    // Next, see if the Table is flat, which we need in order to see where
    // invokes go statically. (In dynamic linking, the table is not flat,
    // and we can't do this.)
    TableUtils::FlatTable flatTable(*module, *module->tables[0]);
    if (!flatTable.valid) {
      return;
    }
    // This code has exceptions. Find functions that definitely cannot throw,
    // and remove invokes to them.
    struct Info
      : public ModuleUtils::CallGraphPropertyAnalysis<Info>::FunctionInfo {
      bool canThrow = false;
    };
    ModuleUtils::CallGraphPropertyAnalysis<Info> analyzer(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Assume any import can throw. We may want to reduce this to just
          // longjmp/cxa_throw/etc.
          info.canThrow = true;
        }
      });

    // Assume a non-direct call might throw.
    analyzer.propagateBack([](const Info& info) { return info.canThrow; },
                           [](const Info& info) { return true; },
                           [](Info& info) { info.canThrow = true; },
                           [](const Info& info, Function* reason) {},
                           analyzer.NonDirectCallsHaveProperty);

    // Apply the information.
    struct OptimizeInvokes : public WalkerPass<PostWalker<OptimizeInvokes>> {
      bool isFunctionParallel() override { return true; }

      std::unique_ptr<Pass> create() override {
        return std::make_unique<OptimizeInvokes>(map, flatTable);
      }

      std::map<Function*, Info>& map;
      TableUtils::FlatTable& flatTable;

      OptimizeInvokes(std::map<Function*, Info>& map,
                      TableUtils::FlatTable& flatTable)
        : map(map), flatTable(flatTable) {}

      void visitCall(Call* curr) {
        auto* target = getModule()->getFunction(curr->target);
        if (!isInvoke(target)) {
          return;
        }
        // The first operand is the function pointer index, which must be
        // constant if we are to optimize it statically.
        if (auto* index = curr->operands[0]->dynCast<Const>()) {
          size_t indexValue = index->value.getUnsigned();
          if (indexValue >= flatTable.names.size()) {
            // UB can lead to indirect calls to invalid pointers.
            return;
          }
          auto actualTarget = flatTable.names[indexValue];
          if (actualTarget.isNull()) {
            // UB can lead to an indirect call of 0 or an index in which there
            // is no function name.
            return;
          }
          if (map[getModule()->getFunction(actualTarget)].canThrow) {
            return;
          }
          // This invoke cannot throw! Make it a direct call.
          curr->target = actualTarget;
          for (Index i = 0; i < curr->operands.size() - 1; i++) {
            curr->operands[i] = curr->operands[i + 1];
          }
          curr->operands.resize(curr->operands.size() - 1);
        }
      }
    };
    OptimizeInvokes(analyzer.map, flatTable).run(getPassRunner(), module);
  }